

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status
fdb_set_block_reusing_params
          (fdb_file_handle *fhandle,size_t block_reusing_threshold,size_t num_keeping_headers)

{
  atomic<unsigned_long> *in_RDX;
  long *in_RDI;
  filemgr *file;
  uint64_t new_val;
  undefined4 local_4;
  
  if ((in_RDI == (long *)0x0) || (*in_RDI == 0)) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    new_val = *(uint64_t *)(*in_RDI + 0x48);
    atomic_store_uint64_t(in_RDX,new_val,memory_order_relaxed);
    atomic_store_uint64_t(in_RDX,new_val,memory_order_relaxed);
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_set_block_reusing_params(fdb_file_handle *fhandle,
                                        size_t block_reusing_threshold,
                                        size_t num_keeping_headers)
{
    if (!fhandle || !fhandle->root) {
        return FDB_RESULT_INVALID_HANDLE;
    }
    filemgr *file = fhandle->root->file;
    atomic_store_uint64_t(&file->config->block_reusing_threshold,
                          block_reusing_threshold, std::memory_order_relaxed);
    atomic_store_uint64_t(&file->config->num_keeping_headers, num_keeping_headers,
                          std::memory_order_relaxed);
    return FDB_RESULT_SUCCESS;
}